

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

RangeValue __thiscall CoreML::RangeValue::divideAndRoundUp(RangeValue *this,RangeValue *other)

{
  size_t sVar1;
  undefined8 extraout_RAX;
  size_t sVar2;
  RangeValue RVar3;
  RangeValue RVar4;
  RangeValue local_18;
  
  if ((this->_isUnbound == false) && (other->_isUnbound != true)) {
    sVar2 = this->_val;
    if (sVar2 == 0) {
      sVar2 = 0;
    }
    else {
      sVar1 = value(other);
      sVar2 = (sVar2 - 1) / sVar1 + 1;
    }
    RangeValue(&local_18,sVar2);
    RVar3._val = local_18._val;
    RVar3._0_8_ = extraout_RAX;
  }
  else {
    RVar3 = operator/(this,other);
    local_18._isUnbound = RVar3._isUnbound;
  }
  local_18._val = RVar3._val;
  RVar4._1_7_ = RVar3._1_7_;
  RVar4._isUnbound = local_18._isUnbound;
  RVar4._val = local_18._val;
  return RVar4;
}

Assistant:

RangeValue RangeValue::divideAndRoundUp(const RangeValue& other) const {

    if (_isUnbound || other.isUnbound()) {
        return *this / other;
    }
    else if (_val == 0) {
        return RangeValue(0);
    }
    else {
        return ((_val - 1) / other.value()) + 1;
    }

}